

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SequenceFeatureType::SequenceFeatureType
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  bool bVar1;
  TypeCase TVar2;
  InternalMetadataWithArenaLite *this_00;
  SizeRange *this_01;
  Int64FeatureType *this_02;
  Int64FeatureType *from_00;
  StringFeatureType *this_03;
  StringFeatureType *from_01;
  SequenceFeatureType *from_local;
  SequenceFeatureType *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SequenceFeatureType_0056a868;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  TypeUnion::TypeUnion((TypeUnion *)&this->Type_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_sizerange(from);
  if (bVar1) {
    this_01 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_01,from->sizerange_);
    this->sizerange_ = this_01;
  }
  else {
    this->sizerange_ = (SizeRange *)0x0;
  }
  clear_has_Type(this);
  TVar2 = Type_case(from);
  if (TVar2 != TYPE_NOT_SET) {
    if (TVar2 == kInt64Type) {
      this_02 = mutable_int64type(this);
      from_00 = int64type(from);
      Int64FeatureType::MergeFrom(this_02,from_00);
    }
    else if (TVar2 == kStringType) {
      this_03 = mutable_stringtype(this);
      from_01 = stringtype(from);
      StringFeatureType::MergeFrom(this_03,from_01);
    }
  }
  return;
}

Assistant:

SequenceFeatureType::SequenceFeatureType(const SequenceFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_sizerange()) {
    sizerange_ = new ::CoreML::Specification::SizeRange(*from.sizerange_);
  } else {
    sizerange_ = NULL;
  }
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SequenceFeatureType)
}